

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

int uECC_sign_with_k(uint8_t *private_key,uint8_t *message_hash,uECC_word_t *k,uint8_t *signature)

{
  uECC_word_t *result;
  ulong *puVar1;
  ulong *puVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 auStack_d8 [8];
  EccPoint p;
  uECC_word_t *k2 [2];
  uECC_word_t uStack_58;
  uECC_word_t tmp [4];
  
  k2[0] = p.y + 3;
  lVar5 = 0;
  while (k[lVar5] == 0) {
    lVar5 = lVar5 + 1;
    if (lVar5 == 4) {
      return 0;
    }
  }
  uVar7 = 3;
  while( true ) {
    iVar4 = (int)uVar7;
    puVar1 = curve_n + uVar7;
    puVar2 = k + uVar7;
    if (*puVar2 < *puVar1) break;
    uVar7 = (ulong)(iVar4 - 1);
    if (iVar4 == 0) {
      return 0;
    }
    if (*puVar1 < *puVar2) {
      return 0;
    }
  }
  lVar5 = 0;
  uVar7 = 0;
  do {
    uVar3 = *(ulong *)((long)k + lVar5);
    uVar9 = uVar3 + uVar7 + *(long *)((long)curve_n + lVar5);
    uVar8 = (ulong)(uVar9 < uVar3);
    if (uVar9 == uVar3) {
      uVar8 = uVar7;
    }
    *(ulong *)((long)tmp + lVar5 + -8) = uVar9;
    lVar5 = lVar5 + 8;
    uVar7 = uVar8;
  } while (lVar5 != 0x20);
  lVar5 = 0;
  uVar7 = 0;
  do {
    uVar3 = *(ulong *)((long)tmp + lVar5 + -8);
    uVar9 = uVar3 + uVar7 + *(long *)((long)curve_n + lVar5);
    if (uVar9 != uVar3) {
      uVar7 = (ulong)(uVar9 < uVar3);
    }
    *(ulong *)((long)p.y + lVar5 + 0x18) = uVar9;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x20);
  EccPoint_mult((EccPoint *)auStack_d8,&curve_G,k2[(uVar8 ^ 1) - 1],(uECC_word_t *)0x0,
                (uint)(uVar9 < uVar3));
  uVar7 = 3;
  do {
    iVar4 = (int)uVar7;
    puVar1 = curve_n + uVar7;
    lVar5 = uVar7 - 1;
    if (p.x[lVar5] < *puVar1) goto LAB_0010440f;
    uVar7 = (ulong)(iVar4 - 1);
  } while ((iVar4 != 0) && (p.x[lVar5] <= *puVar1));
  lVar5 = 0;
  uVar7 = 0;
  do {
    uVar8 = *(long *)((long)curve_n + lVar5) + uVar7;
    puVar1 = (ulong *)((long)p.x + lVar5 + -8);
    uVar3 = *puVar1;
    *puVar1 = *puVar1 - uVar8;
    if (uVar8 != 0) {
      uVar7 = (ulong)(uVar3 < uVar8);
    }
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x20);
LAB_0010440f:
  lVar5 = 0;
  while (p.x[lVar5 + -1] == 0) {
    lVar5 = lVar5 + 1;
    if (lVar5 == 4) {
      return 0;
    }
  }
  bVar10 = true;
  lVar5 = 0;
  k2[1] = (uECC_word_t *)message_hash;
  do {
    lVar5 = lVar5 + 1;
    while (iVar4 = (*g_rng_function)((uint8_t *)&uStack_58,0x20), iVar4 == 0) {
      lVar5 = lVar5 + 1;
      if (lVar5 == 0x41) {
        if (bVar10) {
          tmp[0] = 0;
          tmp[1] = 0;
          tmp[2] = 0;
          uStack_58 = 1;
        }
        goto LAB_001044a2;
      }
    }
    lVar6 = 0;
    do {
      if (tmp[lVar6 + -1] != 0) goto LAB_001044a2;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    bVar10 = false;
  } while (lVar5 != 0x40);
LAB_001044a2:
  vli_modMult_n(k,k,&uStack_58);
  vli_modInv(k,k,curve_n);
  vli_modMult_n(k,k,&uStack_58);
  vli_nativeToBytes(signature,(uint64_t *)auStack_d8);
  tmp[2] = 0;
  vli_bytesToNative(&uStack_58,private_key);
  result = p.y + 3;
  p.y[3] = (uECC_word_t)auStack_d8;
  vli_modMult_n(result,&uStack_58,result);
  vli_bytesToNative(&uStack_58,(uint8_t *)k2[1]);
  vli_modAdd(result,&uStack_58,result,curve_n);
  vli_modMult_n(result,result,k);
  vli_nativeToBytes(signature + 0x20,result);
  return 1;
}

Assistant:

static int uECC_sign_with_k(const uint8_t private_key[uECC_BYTES],
                            const uint8_t message_hash[uECC_BYTES],
                            uECC_word_t k[uECC_N_WORDS],
                            uint8_t signature[uECC_BYTES*2]) {
    uECC_word_t tmp[uECC_N_WORDS];
    uECC_word_t s[uECC_N_WORDS];
    uECC_word_t *k2[2] = {tmp, s};
    EccPoint p;
    uECC_word_t carry;
    uECC_word_t tries;

    /* Make sure 0 < k < curve_n */
    if (vli_isZero(k) || vli_cmp_n(curve_n, k) != 1) {
        return 0;
    }

#if (uECC_CURVE == uECC_secp160r1)
    /* Make sure that we don't leak timing information about k.
       See http://eprint.iacr.org/2011/232.pdf */
    vli_add_n(tmp, k, curve_n);
    carry = (tmp[uECC_WORDS] & 0x02);
    vli_add_n(s, tmp, curve_n);

    /* p = k * G */
    EccPoint_mult(&p, &curve_G, k2[!carry], 0, (uECC_BYTES * 8) + 2);
#else
    /* Make sure that we don't leak timing information about k.
       See http://eprint.iacr.org/2011/232.pdf */
    carry = vli_add(tmp, k, curve_n);
    vli_add(s, tmp, curve_n);

    /* p = k * G */
    EccPoint_mult(&p, &curve_G, k2[!carry], 0, (uECC_BYTES * 8) + 1);

    /* r = x1 (mod n) */
    if (vli_cmp(curve_n, p.x) != 1) {
        vli_sub(p.x, p.x, curve_n);
    }
#endif
    if (vli_isZero(p.x)) {
        return 0;
    }

    // Attempt to get a random number to prevent side channel analysis of k.
    // If the RNG fails every time (eg it was not defined), we continue so that
    // deterministic signing can still work (with reduced security) without
    // an RNG defined.
    carry = 0; // use to signal that the RNG succeeded at least once.
    for (tries = 0; tries < MAX_TRIES; ++tries) {
        if (!g_rng_function((uint8_t *)tmp, sizeof(tmp))) {
            continue;
        }
        carry = 1;
        if (!vli_isZero(tmp)) {
            break;
        }
    }
    if (!carry) {
        vli_clear(tmp);
        tmp[0] = 1;
    }

    /* Prevent side channel analysis of vli_modInv() to determine
       bits of k / the private key by premultiplying by a random number */
    vli_modMult_n(k, k, tmp); /* k' = rand * k */
    vli_modInv_n(k, k, curve_n); /* k = 1 / k' */
    vli_modMult_n(k, k, tmp); /* k = 1 / k */

    vli_nativeToBytes(signature, p.x); /* store r */

    tmp[uECC_N_WORDS - 1] = 0;
    vli_bytesToNative(tmp, private_key); /* tmp = d */
    s[uECC_N_WORDS - 1] = 0;
    vli_set(s, p.x);
    vli_modMult_n(s, tmp, s); /* s = r*d */

    vli_bytesToNative(tmp, message_hash);
    vli_modAdd_n(s, tmp, s, curve_n); /* s = e + r*d */
    vli_modMult_n(s, s, k); /* s = (e + r*d) / k */
#if (uECC_CURVE == uECC_secp160r1)
    if (s[uECC_N_WORDS - 1]) {
        return 0;
    }
#endif
    vli_nativeToBytes(signature + uECC_BYTES, s);
    return 1;
}